

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaConfig.cpp
# Opt level: O1

void __thiscall xmrig::CudaConfig::generate(CudaConfig *this)

{
  int iVar1;
  uint32_t uVar2;
  const_iterator cVar3;
  size_t sVar4;
  vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> devices;
  vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> local_30;
  
  if ((generated == '\0') && (this->m_enabled == true)) {
    String::String((String *)&local_30,"cn/blur");
    cVar3 = std::
            _Rb_tree<xmrig::String,_std::pair<const_xmrig::String,_xmrig::CudaThreads>,_std::_Select1st<std::pair<const_xmrig::String,_xmrig::CudaThreads>_>,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::CudaThreads>_>_>
            ::find((_Rb_tree<xmrig::String,_std::pair<const_xmrig::String,_xmrig::CudaThreads>,_std::_Select1st<std::pair<const_xmrig::String,_xmrig::CudaThreads>_>,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::CudaThreads>_>_>
                    *)&this->m_threads,(String *)&local_30);
    if (local_30.super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete__(local_30.
                        super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>.
                        _M_impl.super__Vector_impl_data._M_start);
    }
    if ((_Rb_tree_header *)cVar3._M_node ==
        &(this->m_threads).m_profiles._M_t._M_impl.super__Rb_tree_header) {
      iVar1 = CudaLib::init((EVP_PKEY_CTX *)(this->m_loader).m_data);
      if ((char)iVar1 != '\0') {
        uVar2 = CudaLib::runtimeVersion();
        if (uVar2 != 0) {
          uVar2 = CudaLib::driverVersion();
          if (uVar2 != 0) {
            uVar2 = CudaLib::deviceCount();
            if (uVar2 != 0) {
              CudaLib::devices(&local_30,this->m_bfactor,this->m_bsleep,&this->m_devicesHint);
              if (local_30.super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_30.super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                sVar4 = xmrig::generate(&this->m_threads,&local_30);
                generated = '\x01';
                this->m_shouldSave = sVar4 != 0;
              }
              std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::~vector(&local_30)
              ;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void xmrig::CudaConfig::generate()
{
    if (generated) {
        return;
    }

    if (!isEnabled() || m_threads.has()) {
        return;
    }

    if (!CudaLib::init(loader())) {
        return;
    }

    if (!CudaLib::runtimeVersion() || !CudaLib::driverVersion() || !CudaLib::deviceCount()) {
        return;
    }

    const auto devices = CudaLib::devices(bfactor(), bsleep(), m_devicesHint);
    if (devices.empty()) {
        return;
    }

    size_t count = 0;
    count += xmrig::generate(m_threads, devices);

    generated    = true;
    m_shouldSave = count > 0;
}